

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcd.c
# Opt level: O3

void trn_bcd(mdl_t *mdl)

{
  int *piVar1;
  byte *pbVar2;
  uint32_t len;
  uint uVar3;
  seq_t **ppsVar4;
  uint64_t *puVar5;
  long lVar6;
  uint64_t *puVar7;
  char *pcVar8;
  bcd_t *bcd;
  long lVar9;
  long lVar10;
  opt_t *poVar11;
  double *pdVar12;
  double *pdVar13;
  void *pvVar14;
  bool bVar15;
  mdl_t *pmVar16;
  _Bool _Var17;
  ulong uVar18;
  void *pvVar19;
  void *pvVar20;
  seq_t *psVar21;
  double *pdVar22;
  void *pvVar23;
  grd_st_t *pgVar24;
  seq_t *psVar25;
  undefined4 uVar26;
  uint64_t uVar27;
  ulong uVar28;
  seq_t *psVar29;
  byte bVar30;
  uint uVar31;
  uint64_t uVar32;
  ulong uVar33;
  uint uVar34;
  size_t size;
  int iVar35;
  ulong uVar36;
  long lVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  void *__s;
  uint32_t n;
  uint64_t uVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  undefined8 uStack_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  void *local_a8;
  uint64_t local_a0;
  double *local_98;
  double local_90;
  void *local_88;
  uint local_80;
  uint32_t local_7c;
  uint32_t *local_78;
  undefined8 uStack_70;
  seq_t *local_60;
  double local_58;
  seq_t *local_50;
  seq_t *local_48;
  mdl_t *local_40;
  uint64_t local_38;
  
  local_b0 = (ulong)mdl->nlbl;
  uVar41 = mdl->nobs;
  local_78 = (uint32_t *)(ulong)mdl->train->mlen;
  local_38 = (uint64_t)mdl->train->nseq;
  local_7c = mdl->opt->maxiter;
  uStack_d0 = 0x105c3b;
  local_40 = mdl;
  info("    - Build the index\n");
  uStack_d0 = 0x105c49;
  info("        1/2 -- scan the sequences\n");
  uVar18 = uVar41 * 4 + 0xf & 0xfffffffffffffff0;
  pvVar23 = (void *)((long)&local_c8 - uVar18);
  __s = (void *)((long)pvVar23 - uVar18);
  if (uVar41 != 0) {
    *(undefined8 *)((long)__s + -8) = 0x105c81;
    memset(pvVar23,0,uVar41 * 4);
    *(undefined8 *)((long)__s + -8) = 0x105c91;
    memset(__s,0xff,uVar41 * 4);
  }
  if (local_38 != 0) {
    ppsVar4 = local_40->train->seq;
    uVar27 = 0;
    do {
      psVar21 = ppsVar4[uVar27];
      uVar34 = psVar21->len;
      if ((ulong)uVar34 != 0) {
        uVar18 = 0;
        do {
          uVar31 = *(uint *)&psVar21[uVar18 * 2 + 1].field_0x4;
          if ((ulong)uVar31 != 0) {
            lVar37 = *(long *)(psVar21 + uVar18 * 2 + 2);
            uVar39 = 0;
            do {
              *(int *)((long)__s + *(long *)(lVar37 + uVar39 * 8) * 4) = (int)uVar27;
              uVar39 = uVar39 + 1;
            } while (uVar31 != uVar39);
          }
          uVar31 = *(uint *)&psVar21[uVar18 * 2 + 1].raw;
          if ((ulong)uVar31 != 0) {
            puVar5 = psVar21[uVar18 * 2 + 2].raw;
            uVar39 = 0;
            do {
              *(int *)((long)__s + puVar5[uVar39] * 4) = (int)uVar27;
              uVar39 = uVar39 + 1;
            } while (uVar39 < uVar31);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar34);
      }
      if (uVar41 != 0) {
        uVar32 = 0;
        do {
          piVar1 = (int *)((long)pvVar23 + uVar32 * 4);
          *piVar1 = *piVar1 + (uint)(uVar27 == *(uint *)((long)__s + uVar32 * 4));
          uVar32 = uVar32 + 1;
        } while (uVar41 != uVar32);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != local_38);
  }
  *(undefined8 *)((long)__s + -8) = 0x105d4f;
  local_88 = xmalloc(uVar41 * 4);
  *(undefined8 *)((long)__s + -8) = 0x105d60;
  pvVar19 = xmalloc(uVar41 * 8);
  pvVar14 = local_88;
  local_a0 = uVar41;
  if (uVar41 == 0) {
    *(undefined8 *)((long)__s + -8) = 0x105de7;
    info("        2/2 -- Populate the index\n");
  }
  else {
    local_58 = (double)(uVar41 * 4);
    uVar41 = 0;
    do {
      uVar34 = *(uint *)((long)pvVar23 + uVar41 * 4);
      *(uint *)((long)pvVar14 + uVar41 * 4) = uVar34;
      *(undefined8 *)((long)__s + -8) = 0x105d8e;
      pvVar20 = xmalloc((ulong)uVar34 << 2);
      *(void **)((long)pvVar19 + uVar41 * 8) = pvVar20;
      uVar41 = uVar41 + 1;
    } while (local_a0 != uVar41);
    *(undefined8 *)((long)__s + -8) = 0x105dac;
    info("        2/2 -- Populate the index\n");
    dVar44 = local_58;
    *(undefined8 *)((long)__s + -8) = 0x105dbd;
    memset(pvVar23,0,(size_t)dVar44);
    *(undefined8 *)((long)__s + -8) = 0x105dcd;
    memset(__s,0xff,(size_t)dVar44);
    uVar41 = local_a0;
  }
  if (local_38 != 0) {
    ppsVar4 = local_40->train->seq;
    uVar27 = 0;
    do {
      psVar21 = ppsVar4[uVar27];
      uVar34 = psVar21->len;
      uVar26 = (undefined4)uVar27;
      if ((ulong)uVar34 != 0) {
        uVar18 = 0;
        do {
          uVar31 = *(uint *)&psVar21[uVar18 * 2 + 1].field_0x4;
          if ((ulong)uVar31 != 0) {
            lVar37 = *(long *)(psVar21 + uVar18 * 2 + 2);
            uVar39 = 0;
            do {
              *(undefined4 *)((long)__s + *(long *)(lVar37 + uVar39 * 8) * 4) = uVar26;
              uVar39 = uVar39 + 1;
            } while (uVar31 != uVar39);
          }
          uVar31 = *(uint *)&psVar21[uVar18 * 2 + 1].raw;
          if ((ulong)uVar31 != 0) {
            puVar5 = psVar21[uVar18 * 2 + 2].raw;
            uVar39 = 0;
            do {
              *(undefined4 *)((long)__s + puVar5[uVar39] * 4) = uVar26;
              uVar39 = uVar39 + 1;
            } while (uVar39 < uVar31);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar34);
      }
      if (uVar41 != 0) {
        uVar32 = 0;
        do {
          if (uVar27 == *(uint *)((long)__s + uVar32 * 4)) {
            lVar37 = *(long *)((long)pvVar19 + uVar32 * 8);
            uVar34 = *(uint *)((long)pvVar23 + uVar32 * 4);
            *(uint *)((long)pvVar23 + uVar32 * 4) = uVar34 + 1;
            *(undefined4 *)(lVar37 + (ulong)uVar34 * 4) = uVar26;
          }
          uVar32 = uVar32 + 1;
        } while (uVar41 != uVar32);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != local_38);
  }
  local_a8 = pvVar19;
  *(undefined8 *)((long)__s + -8) = 0x105eb5;
  info("      Done\n");
  *(undefined8 *)((long)__s + -8) = 0x105ebf;
  psVar21 = (seq_t *)xmalloc(0x38);
  uVar18 = local_b0;
  *(undefined8 *)((long)__s + -8) = 0x105ed1;
  pdVar22 = xvm_new(uVar18);
  *(double **)psVar21 = pdVar22;
  *(undefined8 *)((long)__s + -8) = 0x105edc;
  pdVar22 = xvm_new(uVar18);
  psVar21->raw = (uint64_t *)pdVar22;
  uVar39 = (ulong)(uint)((int)uVar18 * (int)uVar18);
  *(undefined8 *)((long)__s + -8) = 0x105eee;
  pdVar22 = xvm_new(uVar39);
  *(double **)(psVar21 + 1) = pdVar22;
  *(undefined8 *)((long)__s + -8) = 0x105efa;
  pdVar22 = xvm_new(uVar39);
  psVar21[1].raw = (uint64_t *)pdVar22;
  size = (long)local_78 << 2;
  *(undefined8 *)((long)__s + -8) = 0x105f0b;
  pvVar23 = xmalloc(size);
  pmVar16 = local_40;
  *(void **)(psVar21 + 2) = pvVar23;
  *(undefined8 *)((long)__s + -8) = 0x105f1a;
  pgVar24 = grd_stnew(pmVar16,(double *)0x0);
  *(grd_st_t **)(psVar21 + 3) = pgVar24;
  local_48 = psVar21;
  if (local_7c != 0) {
    uVar34 = 1;
    do {
      local_80 = uVar34;
      if (uVar41 != 0) {
        uVar27 = 0;
        do {
          if (uVar18 != 0) {
            lVar37 = *(long *)local_48;
            puVar5 = local_48->raw;
            lVar6 = *(long *)(local_48 + 1);
            puVar7 = local_48[1].raw;
            iVar35 = 0;
            uVar41 = 0;
            do {
              *(undefined8 *)(lVar37 + uVar41 * 8) = 0;
              puVar5[uVar41] = 0;
              iVar38 = 0;
              do {
                *(undefined8 *)(lVar6 + (ulong)(uint)(iVar35 + iVar38) * 8) = 0;
                puVar7[(uint)(iVar35 + iVar38)] = 0;
                iVar38 = iVar38 + 1;
              } while ((int)uVar18 != iVar38);
              uVar41 = uVar41 + 1;
              iVar35 = iVar35 + (int)uVar18;
            } while (uVar41 != uVar18);
          }
          local_38 = uVar27;
          if (*(int *)((long)local_88 + uVar27 * 4) != 0) {
            uVar39 = 0;
            do {
              psVar29 = local_48;
              psVar21 = local_40->train->seq
                        [*(uint *)(*(long *)((long)local_a8 + uVar27 * 8) + uVar39 * 4)];
              uVar34 = psVar21->len;
              local_78 = *(uint32_t **)(local_48 + 2);
              if ((ulong)uVar34 == 0) {
                uVar31 = 0;
              }
              else {
                pcVar8 = local_40->kind;
                uVar36 = 0;
                uVar31 = 0;
                do {
                  pbVar2 = (byte *)(pcVar8 + uVar27);
                  if ((*pbVar2 & 1) == 0) {
                    bVar15 = false;
                  }
                  else {
                    uVar33 = 0;
                    bVar15 = false;
                    do {
                      if (*(uint *)&psVar21[uVar36 * 2 + 1].field_0x4 == uVar33) break;
                      if (*(uint64_t *)(*(long *)(psVar21 + uVar36 * 2 + 2) + uVar33 * 8) ==
                          local_38) {
                        bVar15 = true;
                      }
                      uVar33 = uVar33 + 1;
                      uVar27 = local_38;
                    } while (!bVar15);
                  }
                  if (((*pbVar2 & 2) != 0) && (!bVar15)) {
                    uVar33 = 0;
                    do {
                      if (*(uint *)&psVar21[uVar36 * 2 + 1].raw == uVar33) break;
                      if (psVar21[uVar36 * 2 + 2].raw[uVar33] == uVar27) {
                        bVar15 = true;
                      }
                      uVar33 = uVar33 + 1;
                    } while (!bVar15);
                  }
                  if (bVar15) {
                    uVar33 = (ulong)uVar31;
                    uVar31 = uVar31 + 1;
                    local_78[uVar33] = (uint32_t)uVar36;
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 != uVar34);
              }
              *(uint *)&local_48[2].raw = uVar31;
              pgVar24 = *(grd_st_t **)(local_48 + 3);
              pgVar24->first = *local_78;
              pgVar24->last = local_78[uVar31 - 1];
              len = psVar21->len;
              local_b8 = uVar39;
              local_60 = psVar21;
              *(undefined8 *)((long)__s + -8) = 0x1060d3;
              grd_stcheck(pgVar24,len);
              pgVar24 = *(grd_st_t **)(psVar29 + 3);
              if (local_40->opt->sparse == true) {
                *(undefined8 *)((long)__s + -8) = 0x1060ec;
                grd_spdopsi(pgVar24,psVar21);
                pgVar24 = *(grd_st_t **)(psVar29 + 3);
                *(undefined8 *)((long)__s + -8) = 0x1060f8;
                grd_spfwdbwd(pgVar24,psVar21);
                uVar34 = local_40->nlbl;
                bcd = (bcd_t *)local_40->kind;
                *(undefined8 *)((long)__s + -8) = 0x106111;
                bcd_spgradhes((mdl_t *)(ulong)uVar34,bcd,psVar29,(uint64_t)psVar21);
              }
              else {
                *(undefined8 *)((long)__s + -8) = 0x10612e;
                grd_fldopsi(pgVar24,psVar21);
                pgVar24 = *(grd_st_t **)(psVar29 + 3);
                *(undefined8 *)((long)__s + -8) = 0x10613a;
                grd_flfwdbwd(pgVar24,psVar21);
                uVar34 = local_40->nlbl;
                uVar39 = (ulong)uVar34;
                psVar21 = (seq_t *)local_40->kind;
                lVar37 = *(long *)(psVar29 + 3);
                local_c8 = *(long *)(lVar37 + 0x20);
                local_98 = *(double **)(lVar37 + 0x48);
                local_90 = *(double *)(lVar37 + 0x50);
                lVar6 = *(long *)(lVar37 + 0x68);
                local_58 = *(double *)(psVar29 + 2);
                uVar31 = *(uint *)&psVar29[2].raw;
                lVar9 = *(long *)(psVar29 + 1);
                puVar5 = psVar29[1].raw;
                bVar30 = *(byte *)((long)&psVar21->len + uVar27);
                if ((uVar31 != 0 & bVar30) == 1) {
                  lVar37 = *(long *)(lVar37 + 0x60);
                  lVar10 = *(long *)local_48;
                  puVar7 = local_48->raw;
                  uVar36 = 0;
                  do {
                    uVar33 = (ulong)*(uint *)((long)local_58 + uVar36 * 4);
                    if (uVar34 != 0) {
                      uVar28 = 0;
                      do {
                        dVar44 = local_98[uVar33 * uVar39 + uVar28] *
                                 *(double *)((long)local_90 + uVar33 * uVar39 * 8 + uVar28 * 8) *
                                 *(double *)(lVar37 + uVar33 * 8);
                        *(double *)(lVar10 + uVar28 * 8) = *(double *)(lVar10 + uVar28 * 8) + dVar44
                        ;
                        puVar7[uVar28] =
                             (uint64_t)((1.0 - dVar44) * dVar44 + (double)puVar7[uVar28]);
                        uVar28 = uVar28 + 1;
                      } while (uVar39 != uVar28);
                    }
                    *(double *)(lVar10 + (ulong)local_60[uVar33 * 2 + 1].len * 8) =
                         *(double *)(lVar10 + (ulong)local_60[uVar33 * 2 + 1].len * 8) + -1.0;
                    uVar36 = uVar36 + 1;
                  } while (uVar36 != uVar31);
                  bVar30 = *(byte *)((long)&psVar21->len + local_38);
                  uVar27 = local_38;
                  local_50 = psVar21;
                }
                if (((bVar30 & 2) != 0) && (uVar31 != 0)) {
                  local_c0 = uVar39 * uVar39;
                  local_60 = local_60 + 1;
                  uVar36 = 0;
                  do {
                    uVar3 = *(uint *)((long)local_58 + uVar36 * 4);
                    uVar33 = (ulong)uVar3;
                    if (uVar33 != 0) {
                      local_50 = (seq_t *)(ulong)(uVar3 - 1);
                      if (uVar39 != 0) {
                        lVar37 = local_c8 + local_c0 * uVar33 * 8;
                        uVar18 = 0;
                        iVar35 = 0;
                        do {
                          uVar28 = 0;
                          do {
                            uVar40 = (ulong)(uint)(iVar35 + (int)uVar28);
                            dVar44 = local_98[(long)local_50 * uVar39 + uVar18] *
                                     *(double *)((long)local_90 + uVar33 * uVar39 * 8 + uVar28 * 8)
                                     * *(double *)(lVar37 + uVar28 * 8) *
                                     *(double *)(lVar6 + uVar33 * 8);
                            *(double *)(lVar9 + uVar40 * 8) =
                                 *(double *)(lVar9 + uVar40 * 8) + dVar44;
                            puVar5[uVar40] =
                                 (uint64_t)((1.0 - dVar44) * dVar44 + (double)puVar5[uVar40]);
                            uVar28 = uVar28 + 1;
                          } while (uVar39 != uVar28);
                          uVar18 = uVar18 + 1;
                          lVar37 = lVar37 + uVar39 * 8;
                          iVar35 = iVar35 + (int)uVar28;
                        } while (uVar18 != uVar39);
                      }
                      uVar18 = (ulong)(local_60[(long)local_50 * 2].len * uVar34 +
                                      local_60[uVar33 * 2].len);
                      *(double *)(lVar9 + uVar18 * 8) = *(double *)(lVar9 + uVar18 * 8) + -1.0;
                      uVar18 = local_b0;
                      uVar27 = local_38;
                    }
                    uVar36 = uVar36 + 1;
                  } while (uVar36 != uVar31);
                }
              }
              uVar39 = local_b8 + 1;
            } while (uVar39 < *(uint *)((long)local_88 + uVar27 * 4));
          }
          poVar11 = local_40->opt;
          local_78 = (uint32_t *)poVar11->rho1;
          local_58 = poVar11->rho2;
          dVar44 = (poVar11->bcd).kappa;
          psVar21 = (seq_t *)(ulong)local_40->nlbl;
          lVar37 = *(long *)(local_48 + 1);
          uStack_70 = 0;
          pdVar22 = (double *)local_48[1].raw;
          if ((local_40->kind[uVar27] & 1U) != 0) {
            lVar6 = *(long *)local_48;
            pdVar12 = (double *)local_48->raw;
            if (psVar21 == (seq_t *)0x0) {
              dVar42 = 1.0;
              psVar29 = (seq_t *)0x0;
            }
            else {
              psVar25 = (seq_t *)0x0;
              dVar43 = 1.0;
              do {
                dVar42 = ABS(*(double *)(lVar6 + (long)psVar25 * 8) / pdVar12[(long)psVar25]);
                if (dVar42 <= dVar43) {
                  dVar42 = dVar43;
                }
                psVar25 = (seq_t *)((long)&psVar25->len + 1);
                psVar29 = psVar21;
                dVar43 = dVar42;
              } while (psVar21 != psVar25);
            }
            local_98 = (double *)local_48[1].raw;
            local_90 = dVar44;
            local_60 = psVar29;
            local_50 = psVar21;
            *(undefined8 *)((long)__s + -8) = 0x106474;
            xvm_scale(pdVar12,pdVar12,dVar42 * dVar44,(uint64_t)psVar29);
            pdVar22 = local_98;
            psVar21 = local_50;
            dVar44 = local_90;
            if (local_50 != (seq_t *)0x0) {
              uVar41 = local_40->uoff[local_38];
              pdVar13 = local_40->theta;
              psVar29 = (seq_t *)0x0;
              do {
                dVar42 = pdVar13[(long)&psVar29->len + uVar41] * pdVar12[(long)psVar29] -
                         *(double *)(lVar6 + (long)psVar29 * 8);
                if (dVar42 <= (double)local_78) {
                  dVar43 = 0.0;
                  if (dVar42 < -(double)local_78) {
                    dVar43 = dVar42 + (double)local_78;
                  }
                }
                else {
                  dVar43 = dVar42 - (double)local_78;
                }
                pdVar13[(long)&psVar29->len + uVar41] = dVar43 / (pdVar12[(long)psVar29] + local_58)
                ;
                psVar29 = (seq_t *)((long)&psVar29->len + 1);
              } while (local_60 != psVar29);
            }
          }
          if ((local_40->kind[local_38] & 2U) != 0) {
            uVar34 = (int)psVar21 * (int)psVar21;
            local_50 = (seq_t *)(ulong)uVar34;
            if (uVar34 == 0) {
              uVar41 = 0;
              dVar42 = 1.0;
            }
            else {
              uVar41 = (uint64_t)uVar34;
              uVar39 = 0;
              dVar43 = 1.0;
              do {
                dVar42 = ABS(*(double *)(lVar37 + uVar39 * 8) / pdVar22[uVar39]);
                if (dVar42 <= dVar43) {
                  dVar42 = dVar43;
                }
                uVar39 = uVar39 + 1;
                dVar43 = dVar42;
              } while (uVar41 != uVar39);
            }
            *(undefined8 *)((long)__s + -8) = 0x106589;
            xvm_scale(pdVar22,pdVar22,dVar44 * dVar42,uVar41);
            if ((int)local_50 != 0) {
              uVar27 = local_40->boff[local_38];
              pdVar12 = local_40->theta;
              uVar32 = 0;
              do {
                dVar44 = pdVar12[uVar27 + uVar32] * pdVar22[uVar32] -
                         *(double *)(lVar37 + uVar32 * 8);
                if (dVar44 <= (double)local_78) {
                  dVar42 = 0.0;
                  if (dVar44 < -(double)local_78) {
                    dVar42 = dVar44 + (double)local_78;
                  }
                }
                else {
                  dVar42 = dVar44 - (double)local_78;
                }
                pdVar12[uVar27 + uVar32] = dVar42 / (pdVar22[uVar32] + local_58);
                uVar32 = uVar32 + 1;
              } while (uVar41 != uVar32);
            }
          }
          uVar27 = local_38 + 1;
          uVar41 = local_a0;
        } while (uVar27 != local_a0);
      }
      pmVar16 = local_40;
      uVar34 = local_80;
      *(undefined8 *)((long)__s + -8) = 0x10663a;
      _Var17 = uit_progress(pmVar16,uVar34,-1.0);
    } while ((_Var17) && (uVar34 = local_80 + 1, uVar34 <= local_7c));
    pgVar24 = *(grd_st_t **)(local_48 + 3);
  }
  psVar21 = local_48;
  *(undefined8 *)((long)__s + -8) = 0x106672;
  grd_stfree(pgVar24);
  pdVar22 = *(double **)psVar21;
  *(undefined8 *)((long)__s + -8) = 0x10667a;
  xvm_free(pdVar22);
  pdVar22 = (double *)psVar21->raw;
  *(undefined8 *)((long)__s + -8) = 0x106683;
  xvm_free(pdVar22);
  pdVar22 = *(double **)(psVar21 + 1);
  *(undefined8 *)((long)__s + -8) = 0x10668c;
  xvm_free(pdVar22);
  pdVar22 = (double *)psVar21[1].raw;
  *(undefined8 *)((long)__s + -8) = 0x106695;
  xvm_free(pdVar22);
  pvVar23 = *(void **)(psVar21 + 2);
  *(undefined8 *)((long)__s + -8) = 0x10669e;
  free(pvVar23);
  *(undefined8 *)((long)__s + -8) = 0x1066a6;
  free(psVar21);
  pvVar23 = local_a8;
  if (uVar41 != 0) {
    uVar27 = 0;
    do {
      pvVar14 = *(void **)((long)pvVar23 + uVar27 * 8);
      *(undefined8 *)((long)__s + -8) = 0x1066bd;
      free(pvVar14);
      uVar27 = uVar27 + 1;
    } while (uVar41 != uVar27);
  }
  *(undefined8 *)((long)__s + -8) = 0x1066cd;
  free(pvVar23);
  free(local_88);
  return;
}

Assistant:

void trn_bcd(mdl_t *mdl) {
	const uint32_t Y = mdl->nlbl;
	const uint64_t O = mdl->nobs;
	const uint32_t S = mdl->train->nseq;
	const uint32_t T = mdl->train->mlen;
	const uint32_t K = mdl->opt->maxiter;
	// Build the index:
	//   Count active sequences per blocks
	info("    - Build the index\n");
	info("        1/2 -- scan the sequences\n");
	uint64_t tot = 0;
	uint32_t cnt[O], lcl[O];
	for (uint64_t o = 0; o < O; o++)
		cnt[o] = 0, lcl[o] = (uint32_t)-1;
	for (uint32_t s = 0; s < S; s++) {
		// List actives blocks
		const seq_t *seq = mdl->train->seq[s];
		for (uint32_t t = 0; t < seq->len; t++) {
			for (uint32_t b = 0; b < seq->pos[t].ucnt; b++)
				lcl[seq->pos[t].uobs[b]] = s;
			for (uint32_t b = 0; b < seq->pos[t].bcnt; b++)
				lcl[seq->pos[t].bobs[b]] = s;
		}
		// Updates blocks count
		for (uint64_t o = 0; o < O; o++)
			cnt[o] += (lcl[o] == s);
	}
	for (uint64_t o = 0; o < O; o++)
		tot += cnt[o];
	// Allocate memory
	uint32_t  *idx_cnt = xmalloc(sizeof(uint32_t  ) * O);
	uint32_t **idx_lst = xmalloc(sizeof(uint32_t *) * O);
	for (uint64_t o = 0; o < O; o++) {
		idx_cnt[o] = cnt[o];
		idx_lst[o] = xmalloc(sizeof(uint32_t) * cnt[o]);
	}
	// Populate the index
	info("        2/2 -- Populate the index\n");
	for (uint64_t o = 0; o < O; o++)
		cnt[o] = 0, lcl[o] = (uint32_t)-1;
	for (uint32_t s = 0; s < S; s++) {
		// List actives blocks
		const seq_t *seq = mdl->train->seq[s];
		for (uint32_t t = 0; t < seq->len; t++) {
			for (uint32_t b = 0; b < seq->pos[t].ucnt; b++)
				lcl[seq->pos[t].uobs[b]] = s;
			for (uint32_t b = 0; b < seq->pos[t].bcnt; b++)
				lcl[seq->pos[t].bobs[b]] = s;
		}
		// Build index
		for (uint64_t o = 0; o < O; o++)
			if (lcl[o] == s)
				idx_lst[o][cnt[o]++] = s;
	}
	info("      Done\n");
	// Allocate the specific trainer of BCD
	bcd_t *bcd = xmalloc(sizeof(bcd_t));
	bcd->ugrd   = xvm_new(Y);
	bcd->uhes   = xvm_new(Y);
	bcd->bgrd   = xvm_new(Y * Y);
	bcd->bhes   = xvm_new(Y * Y);
	bcd->actpos = xmalloc(sizeof(int) * T);
	bcd->grd_st = grd_stnew(mdl, NULL);
	// And train the model
	for (uint32_t i = 1; i <= K; i++) {
		for (uint64_t o = 0; o < O; o++) {
			// Clear the gradient and the hessian
			for (uint32_t y = 0, d = 0; y < Y; y++) {
				bcd->ugrd[y] = 0.0;
				bcd->uhes[y] = 0.0;
				for (uint32_t yp = 0; yp < Y; yp++, d++) {
					bcd->bgrd[d] = 0.0;
					bcd->bhes[d] = 0.0;
				}
			}
			// Process active sequences
			for (uint32_t s = 0; s < idx_cnt[o]; s++) {
				const uint32_t id = idx_lst[o][s];
				const seq_t *seq = mdl->train->seq[id];
				bcd_actpos(mdl, bcd, seq, o);
				grd_stcheck(bcd->grd_st, seq->len);
				if (mdl->opt->sparse) {
					grd_spdopsi(bcd->grd_st, seq);
					grd_spfwdbwd(bcd->grd_st, seq);
					bcd_spgradhes(mdl, bcd, seq, o);
				} else {
					grd_fldopsi(bcd->grd_st, seq);
					grd_flfwdbwd(bcd->grd_st, seq);
					bcd_flgradhes(mdl, bcd, seq, o);
				}
			}
			// And update the model
			bcd_update(mdl, bcd, o);
		}
		if (!uit_progress(mdl, i, -1.0))
			break;
	}
	// Cleanup memory
	grd_stfree(bcd->grd_st);
	xvm_free(bcd->ugrd); xvm_free(bcd->uhes);
	xvm_free(bcd->bgrd); xvm_free(bcd->bhes);
	free(bcd->actpos);
	free(bcd);
	for (uint64_t o = 0; o < O; o++)
		free(idx_lst[o]);
	free(idx_lst);
	free(idx_cnt);
}